

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

bool __thiscall
VmaDefragmentationContext_T::MoveDataToFreeBlocks
          (VmaDefragmentationContext_T *this,VmaSuballocationType currentType,VmaBlockVector *vector
          ,size_t firstFreeBlock,bool *texturePresent,bool *bufferPresent,bool *otherPresent)

{
  byte bVar1;
  size_t sVar2;
  VmaBlockMetadata *pVVar3;
  size_t sVar4;
  byte bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool *pbVar8;
  undefined4 extraout_var_01;
  VmaSuballocationType VVar9;
  uint uVar10;
  VmaSuballocationType VVar11;
  VmaAllocationCreateFlags VVar12;
  size_t sVar13;
  bool bVar14;
  MoveAllocationData moveData;
  undefined4 local_94;
  MoveAllocationData local_60;
  long lVar7;
  
  sVar2 = (this->m_Moves).m_Count;
  local_94 = (undefined4)sVar2;
  sVar4 = firstFreeBlock;
  do {
    sVar13 = sVar4;
    if (sVar13 == 0) break;
    pVVar3 = (vector->m_Blocks).m_pArray[sVar13 - 1]->m_pMetadata;
    iVar6 = (*pVVar3->_vptr_VmaBlockMetadata[0xb])(pVVar3);
    lVar7 = CONCAT44(extraout_var,iVar6);
    if (lVar7 == 0) {
      bVar14 = true;
    }
    else {
      do {
        local_60.move.operation = VMA_DEFRAGMENTATION_MOVE_OPERATION_COPY;
        local_60.move.srcAllocation = (VmaAllocation)0x0;
        local_60.move.dstTmpAllocation = (VmaAllocation)0x0;
        iVar6 = (*pVVar3->_vptr_VmaBlockMetadata[10])(pVVar3,lVar7);
        local_60.move.srcAllocation = (VmaAllocation)CONCAT44(extraout_var_00,iVar6);
        local_60.size = (local_60.move.srcAllocation)->m_Size;
        local_60.alignment = (local_60.move.srcAllocation)->m_Alignment;
        bVar1 = (local_60.move.srcAllocation)->m_SuballocationType;
        local_60.type = (VmaSuballocationType)bVar1;
        VVar12 = ((local_60.move.srcAllocation)->m_Flags & 1) * 4;
        local_60.flags = VVar12 + 0xc00;
        if (((local_60.move.srcAllocation)->m_Flags & 2) == 0) {
          local_60.flags = VVar12;
        }
        uVar10 = 6;
        if ((VmaDefragmentationContext_T *)(local_60.move.srcAllocation)->m_pUserData != this) {
          iVar6 = 0;
          if (this->m_MaxPassBytes < local_60.size + (this->m_PassStats).bytesMoved) {
            bVar5 = this->m_IgnoredAllocs + 1;
            this->m_IgnoredAllocs = bVar5;
            iVar6 = 2 - (uint)(bVar5 < 0x10);
          }
          if (iVar6 == 1) goto LAB_001c1599;
          if (iVar6 == 2) {
            local_94 = 1;
            uVar10 = 1;
            goto LAB_001c1599;
          }
          VVar9 = currentType;
          if ((int)local_60.type < (int)currentType) {
            VVar9 = (uint)bVar1;
          }
          VVar11 = (uint)bVar1;
          if ((int)local_60.type <= (int)currentType) {
            VVar11 = currentType;
          }
          switch(VVar9) {
          case VMA_SUBALLOCATION_TYPE_FREE:
          case VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL:
            goto switchD_001c14c1_caseD_0;
          default:
            goto switchD_001c14c1_caseD_1;
          case VMA_SUBALLOCATION_TYPE_BUFFER:
            bVar14 = (VVar11 - VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN & 0xfffffffd) == 0;
            break;
          case VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN:
            bVar14 = VVar11 - VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN < 3;
            break;
          case VMA_SUBALLOCATION_TYPE_IMAGE_LINEAR:
            bVar14 = VVar11 == VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL;
          }
          if (!bVar14) {
switchD_001c14c1_caseD_0:
            bVar14 = AllocInOtherBlock(this,firstFreeBlock,(vector->m_Blocks).m_Count,&local_60,
                                       vector);
            if (bVar14) {
              uVar10 = 1;
              local_94 = 0;
              goto LAB_001c1599;
            }
          }
switchD_001c14c1_caseD_1:
          VVar9 = VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL;
          if ((int)local_60.type < 5) {
            VVar9 = local_60.type;
          }
          switch(VVar9) {
          case VMA_SUBALLOCATION_TYPE_FREE:
          case VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL:
            goto switchD_001c1539_caseD_0;
          default:
            goto switchD_001c1539_caseD_1;
          case VMA_SUBALLOCATION_TYPE_BUFFER:
          case VMA_SUBALLOCATION_TYPE_IMAGE_LINEAR:
            bVar14 = (int)local_60.type < 6;
            break;
          case VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN:
            VVar9 = VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL;
            if (5 < (int)local_60.type) {
              VVar9 = local_60.type;
            }
            bVar14 = VVar9 - VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN < 3;
          }
          if (bVar14) {
switchD_001c1539_caseD_1:
            VVar9 = VMA_SUBALLOCATION_TYPE_BUFFER;
            if ((int)local_60.type < 2) {
              VVar9 = local_60.type;
            }
            pbVar8 = bufferPresent;
            if (((VVar9 != VMA_SUBALLOCATION_TYPE_FREE) &&
                (VVar9 != VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL)) &&
               ((VVar9 != VMA_SUBALLOCATION_TYPE_BUFFER ||
                ((local_60.type == VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN ||
                 (local_60.type == VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL)))))) {
              pbVar8 = otherPresent;
            }
          }
          else {
switchD_001c1539_caseD_0:
            pbVar8 = texturePresent;
          }
          *pbVar8 = true;
          uVar10 = 0;
        }
LAB_001c1599:
        if ((uVar10 != 6) && (uVar10 != 0)) goto LAB_001c15bf;
        iVar6 = (*pVVar3->_vptr_VmaBlockMetadata[0xc])(pVVar3,lVar7);
        lVar7 = CONCAT44(extraout_var_01,iVar6);
      } while (lVar7 != 0);
      uVar10 = 0;
LAB_001c15bf:
      bVar14 = (uVar10 & 3) == 0;
    }
    sVar4 = sVar13 - 1;
  } while (bVar14);
  if (sVar13 == 0) {
    local_94._0_1_ = sVar2 == (this->m_Moves).m_Count;
  }
  return (bool)((byte)local_94 & 1);
}

Assistant:

bool VmaDefragmentationContext_T::MoveDataToFreeBlocks(VmaSuballocationType currentType, 
    VmaBlockVector& vector, size_t firstFreeBlock,
    bool& texturePresent, bool& bufferPresent, bool& otherPresent)
{
    const size_t prevMoveCount = m_Moves.size();
    for (size_t i = firstFreeBlock ; i;)
    {
        VmaDeviceMemoryBlock* block = vector.GetBlock(--i);
        VmaBlockMetadata* metadata = block->m_pMetadata;

        for (VmaAllocHandle handle = metadata->GetAllocationListBegin();
            handle != VK_NULL_HANDLE;
            handle = metadata->GetNextAllocation(handle))
        {
            MoveAllocationData moveData = GetMoveData(handle, metadata);
            // Ignore newly created allocations by defragmentation algorithm
            if (moveData.move.srcAllocation->GetUserData() == this)
                continue;
            switch (CheckCounters(moveData.move.srcAllocation->GetSize()))
            {
            case CounterStatus::Ignore:
                continue;
            case CounterStatus::End:
                return true;
            default:
                VMA_ASSERT(0);
            case CounterStatus::Pass:
                break;
            }

            // Move only single type of resources at once
            if (!VmaIsBufferImageGranularityConflict(moveData.type, currentType))
            {
                // Try to fit allocation into free blocks
                if (AllocInOtherBlock(firstFreeBlock, vector.GetBlockCount(), moveData, vector))
                    return false;
            }

            if (!VmaIsBufferImageGranularityConflict(moveData.type, VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL))
                texturePresent = true;
            else if (!VmaIsBufferImageGranularityConflict(moveData.type, VMA_SUBALLOCATION_TYPE_BUFFER))
                bufferPresent = true;
            else
                otherPresent = true;
        }
    }
    return prevMoveCount == m_Moves.size();
}